

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O0

void __thiscall
kj::StringTree::
fill<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::CappedArray<char,8ul>,kj::ArrayPtr<char_const>>
          (StringTree *this,char *pos,size_t branchIndex,StringTree *first,
          ArrayPtr<const_char> *rest,ArrayPtr<const_char> *rest_1,ArrayPtr<const_char> *rest_2,
          String *rest_3,ArrayPtr<const_char> *rest_4,String *rest_5,ArrayPtr<const_char> *rest_6,
          ArrayPtr<const_char> *rest_7,ArrayPtr<const_char> *rest_8,ArrayPtr<const_char> *rest_9,
          ArrayPtr<const_char> *rest_10,ArrayPtr<const_char> *rest_11,String *rest_12,
          ArrayPtr<const_char> *rest_13,String *rest_14,ArrayPtr<const_char> *rest_15,
          ArrayPtr<const_char> *rest_16,ArrayPtr<const_char> *rest_17,
          CappedArray<char,_8UL> *rest_18,ArrayPtr<const_char> *rest_19)

{
  char *pcVar1;
  Branch *pBVar2;
  StringTree *pSVar3;
  ArrayPtr<const_char> *first_00;
  ArrayPtr<const_char> *rest_20;
  ArrayPtr<const_char> *rest_1_00;
  String *rest_2_00;
  ArrayPtr<const_char> *rest_3_00;
  String *rest_4_00;
  ArrayPtr<const_char> *rest_5_00;
  ArrayPtr<const_char> *rest_6_00;
  ArrayPtr<const_char> *rest_7_00;
  ArrayPtr<const_char> *rest_8_00;
  ArrayPtr<const_char> *rest_9_00;
  ArrayPtr<const_char> *rest_10_00;
  String *rest_11_00;
  ArrayPtr<const_char> *rest_12_00;
  String *rest_13_00;
  ArrayPtr<const_char> *rest_14_00;
  ArrayPtr<const_char> *rest_15_00;
  ArrayPtr<const_char> *rest_16_00;
  CappedArray<char,_8UL> *rest_17_00;
  ArrayPtr<const_char> *rest_18_00;
  ArrayPtr<const_char> *rest_local_1;
  ArrayPtr<const_char> *rest_local;
  StringTree *first_local;
  size_t branchIndex_local;
  char *pos_local;
  StringTree *this_local;
  
  pcVar1 = String::begin(&this->text);
  pBVar2 = Array<kj::StringTree::Branch>::operator[](&this->branches,branchIndex);
  pBVar2->index = (long)pos - (long)pcVar1;
  pSVar3 = mv<kj::StringTree>(first);
  pBVar2 = Array<kj::StringTree::Branch>::operator[](&this->branches,branchIndex);
  operator=(&pBVar2->content,pSVar3);
  first_00 = fwd<kj::ArrayPtr<char_const>>(rest);
  rest_20 = fwd<kj::ArrayPtr<char_const>>(rest_1);
  rest_1_00 = fwd<kj::ArrayPtr<char_const>>(rest_2);
  rest_2_00 = fwd<kj::String>(rest_3);
  rest_3_00 = fwd<kj::ArrayPtr<char_const>>(rest_4);
  rest_4_00 = fwd<kj::String>(rest_5);
  rest_5_00 = fwd<kj::ArrayPtr<char_const>>(rest_6);
  rest_6_00 = fwd<kj::ArrayPtr<char_const>>(rest_7);
  rest_7_00 = fwd<kj::ArrayPtr<char_const>>(rest_8);
  rest_8_00 = fwd<kj::ArrayPtr<char_const>>(rest_9);
  rest_9_00 = fwd<kj::ArrayPtr<char_const>>(rest_10);
  rest_10_00 = fwd<kj::ArrayPtr<char_const>>(rest_11);
  rest_11_00 = fwd<kj::String>(rest_12);
  rest_12_00 = fwd<kj::ArrayPtr<char_const>>(rest_13);
  rest_13_00 = fwd<kj::String>(rest_14);
  rest_14_00 = fwd<kj::ArrayPtr<char_const>>(rest_15);
  rest_15_00 = fwd<kj::ArrayPtr<char_const>>(rest_16);
  rest_16_00 = fwd<kj::ArrayPtr<char_const>>(rest_17);
  rest_17_00 = fwd<kj::CappedArray<char,8ul>>(rest_18);
  rest_18_00 = fwd<kj::ArrayPtr<char_const>>(rest_19);
  fill<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::CappedArray<char,8ul>,kj::ArrayPtr<char_const>>
            (this,pos,branchIndex + 1,first_00,rest_20,rest_1_00,rest_2_00,rest_3_00,rest_4_00,
             rest_5_00,rest_6_00,rest_7_00,rest_8_00,rest_9_00,rest_10_00,rest_11_00,rest_12_00,
             rest_13_00,rest_14_00,rest_15_00,rest_16_00,rest_17_00,rest_18_00);
  return;
}

Assistant:

void StringTree::fill(char* pos, size_t branchIndex, StringTree&& first, Rest&&... rest) {
  branches[branchIndex].index = pos - text.begin();
  branches[branchIndex].content = kj::mv(first);
  fill(pos, branchIndex + 1, kj::fwd<Rest>(rest)...);
}